

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Glucose::SimpSolver::asymmVar(SimpSolver *this,Var v)

{
  bool bVar1;
  long lVar2;
  vec<unsigned_int> *pvVar3;
  int local_1c;
  
  lVar2 = (long)v;
  local_1c = v;
  if ((this->occurs).dirty.data[lVar2] != '\0') {
    OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::clean
              (&this->occurs,&local_1c);
    lVar2 = (long)local_1c;
  }
  bVar1 = true;
  if (((this->super_Solver).assigns.data[lVar2].value & 2) != 0) {
    pvVar3 = (this->occurs).occs.data + lVar2;
    if (pvVar3->sz != 0) {
      if (0 < pvVar3->sz) {
        lVar2 = 0;
        do {
          bVar1 = asymm(this,local_1c,pvVar3->data[lVar2]);
          if (!bVar1) {
            return false;
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < pvVar3->sz);
      }
      bVar1 = backwardSubsumptionCheck(this,false);
    }
  }
  return bVar1;
}

Assistant:

bool SimpSolver::asymmVar(Var v)
{
    assert(use_simplification);

    const vec<CRef>& cls = occurs.lookup(v);

    if (value(v) != l_Undef || cls.size() == 0)
        return true;

    for (int i = 0; i < cls.size(); i++)
        if (!asymm(v, cls[i]))
            return false;

    return backwardSubsumptionCheck();
}